

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemFilter.h
# Opt level: O1

void __thiscall
Assimp::FileSystemFilter::FileSystemFilter(FileSystemFilter *this,string *file,IOSystem *old)

{
  string *__rhs;
  char cVar1;
  pointer pcVar2;
  size_type sVar3;
  int iVar4;
  ulong uVar5;
  Logger *this_00;
  long *plVar6;
  long *plVar7;
  long *local_70;
  long local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (this->super_IOSystem).m_pathStack.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_IOSystem).m_pathStack.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_IOSystem).m_pathStack.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_IOSystem)._vptr_IOSystem = (_func_int **)&PTR__FileSystemFilter_00258970;
  this->mWrapped = old;
  (this->mSrc_file)._M_dataplus._M_p = (pointer)&(this->mSrc_file).field_2;
  pcVar2 = (file->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->mSrc_file,pcVar2,pcVar2 + file->_M_string_length);
  __rhs = &this->mBase;
  (this->mBase)._M_dataplus._M_p = (pointer)&(this->mBase).field_2;
  (this->mBase)._M_string_length = 0;
  (this->mBase).field_2._M_local_buf[0] = '\0';
  iVar4 = (*this->mWrapped->_vptr_IOSystem[3])();
  this->mSep = (char)iVar4;
  if (this->mWrapped == (IOSystem *)0x0) {
    __assert_fail("nullptr != mWrapped",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/Common/FileSystemFilter.h"
                  ,0x47,
                  "Assimp::FileSystemFilter::FileSystemFilter(const std::string &, IOSystem *)");
  }
  std::__cxx11::string::_M_assign((string *)__rhs);
  uVar5 = std::__cxx11::string::find_last_of((char *)__rhs,0x1eda08,0xffffffffffffffff);
  if (uVar5 == 0xffffffffffffffff) {
    std::__cxx11::string::_M_replace((ulong)__rhs,0,(char *)(this->mBase)._M_string_length,0x22ba1d)
    ;
  }
  else {
    std::__cxx11::string::erase((ulong)__rhs,uVar5);
  }
  sVar3 = (this->mBase)._M_string_length;
  if (sVar3 == 0) {
    std::__cxx11::string::_M_replace((ulong)__rhs,0,(char *)0x0,0x1e9e81);
  }
  else {
    cVar1 = (__rhs->_M_dataplus)._M_p[sVar3 - 1];
    if ((cVar1 == '/') || (cVar1 == '\\')) goto LAB_00144edd;
  }
  (*(this->super_IOSystem)._vptr_IOSystem[3])(this);
  std::__cxx11::string::push_back((char)__rhs);
LAB_00144edd:
  this_00 = DefaultLogger::get();
  std::operator+(&local_50,"Import root directory is \'",__rhs);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
  plVar7 = plVar6 + 2;
  if ((long *)*plVar6 == plVar7) {
    local_60 = *plVar7;
    lStack_58 = plVar6[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar7;
    local_70 = (long *)*plVar6;
  }
  *plVar6 = (long)plVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  Logger::info(this_00,(char *)local_70);
  if (local_70 != &local_60) {
    operator_delete(local_70);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

FileSystemFilter(const std::string& file, IOSystem* old)
    : mWrapped  (old)
    , mSrc_file(file)
    , mSep(mWrapped->getOsSeparator()) {
        ai_assert(nullptr != mWrapped);

        // Determine base directory
        mBase = mSrc_file;
        std::string::size_type ss2;
        if (std::string::npos != (ss2 = mBase.find_last_of("\\/")))  {
            mBase.erase(ss2,mBase.length()-ss2);
        } else {
            mBase = "";
        }

        // make sure the directory is terminated properly
        char s;

        if ( mBase.empty() ) {
            mBase = ".";
            mBase += getOsSeparator();
        } else if ((s = *(mBase.end()-1)) != '\\' && s != '/') {
            mBase += getOsSeparator();
        }

        DefaultLogger::get()->info("Import root directory is \'" + mBase + "\'");
    }